

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_decrypt
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *sig,uchar *deckey32,
              uchar *adaptor_sig162)

{
  uint uVar1;
  int flag;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  int overflow;
  secp256k1_scalar local_b8;
  secp256k1_scalar sigr;
  secp256k1_scalar local_70;
  secp256k1_scalar local_50;
  
  if (sig == (secp256k1_ecdsa_signature *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "sig != NULL";
  }
  else if (deckey32 == (uchar *)0x0) {
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "deckey32 != NULL";
  }
  else {
    if (adaptor_sig162 != (uchar *)0x0) {
      local_b8.d[2] = 0;
      local_b8.d[3] = 0;
      local_b8.d[0] = 0;
      local_b8.d[1] = 0;
      secp256k1_scalar_set_b32(&local_50,deckey32,&overflow);
      uVar1 = secp256k1_ecdsa_adaptor_sig_deserialize
                        ((secp256k1_ge *)0x0,&sigr,(secp256k1_ge *)0x0,&local_b8,
                         (secp256k1_scalar *)0x0,(secp256k1_scalar *)0x0,adaptor_sig162);
      if (overflow != 0) {
        uVar1 = 0;
      }
      auVar6._0_4_ = -(uint)((int)local_50.d[2] == 0 && (int)local_50.d[0] == 0);
      auVar6._4_4_ = -(uint)(local_50.d[2]._4_4_ == 0 && local_50.d[0]._4_4_ == 0);
      auVar6._8_4_ = -(uint)((int)local_50.d[3] == 0 && (int)local_50.d[1] == 0);
      auVar6._12_4_ = -(uint)(local_50.d[3]._4_4_ == 0 && local_50.d[1]._4_4_ == 0);
      uVar2 = movmskps(overflow,auVar6);
      uVar3 = uVar2 ^ 0xf;
      if ((uVar2 ^ 0xf) != 0) {
        uVar3 = uVar1;
      }
      secp256k1_scalar_inverse(&local_70,&local_50);
      secp256k1_scalar_mul(&local_70,&local_70,&local_b8);
      flag = secp256k1_scalar_is_high(&local_70);
      secp256k1_scalar_cond_negate(&local_70,flag);
      *(uint64_t *)sig->data = sigr.d[0];
      *(uint64_t *)(sig->data + 8) = sigr.d[1];
      *(uint64_t *)(sig->data + 0x10) = sigr.d[2];
      *(uint64_t *)(sig->data + 0x18) = sigr.d[3];
      *(uint64_t *)(sig->data + 0x20) = local_70.d[0];
      *(uint64_t *)(sig->data + 0x28) = local_70.d[1];
      *(uint64_t *)(sig->data + 0x30) = local_70.d[2];
      *(uint64_t *)(sig->data + 0x38) = local_70.d[3];
      secp256k1_memczero(sig,0x40,uVar3 ^ 1);
      return uVar3;
    }
    pvVar4 = (ctx->illegal_callback).data;
    pcVar5 = "adaptor_sig162 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar5,pvVar4);
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_decrypt(const secp256k1_context* ctx, secp256k1_ecdsa_signature *sig, const unsigned char *deckey32, const unsigned char *adaptor_sig162) {
    secp256k1_scalar deckey;
    secp256k1_scalar sp;
    secp256k1_scalar s;
    secp256k1_scalar sigr;
    int overflow;
    int high;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(sig != NULL);
    ARG_CHECK(deckey32 != NULL);
    ARG_CHECK(adaptor_sig162 != NULL);

    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_set_b32(&deckey, deckey32, &overflow);
    ret &= !overflow;
    ret &= secp256k1_ecdsa_adaptor_sig_deserialize(NULL, &sigr, NULL, &sp, NULL, NULL, adaptor_sig162);
    ret &= !secp256k1_scalar_is_zero(&deckey);
    secp256k1_scalar_inverse(&s, &deckey);
    /* s = s' * y⁻¹ */
    secp256k1_scalar_mul(&s, &s, &sp);
    high = secp256k1_scalar_is_high(&s);
    secp256k1_scalar_cond_negate(&s, high);
    secp256k1_ecdsa_signature_save(sig, &sigr, &s);

    secp256k1_memczero(&sig->data[0], 64, !ret);
    secp256k1_scalar_clear(&deckey);
    secp256k1_scalar_clear(&sp);
    secp256k1_scalar_clear(&s);

    return ret;
}